

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createTexture_checker(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  runtime_error *this_00;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  float fVar4;
  SP SVar5;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP tex;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffeb8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string local_c8 [36];
  float in_stack_ffffffffffffff5c;
  string *in_stack_ffffffffffffff60;
  ParamSet *in_stack_ffffffffffffff68;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  ParamSet *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  ParamSet *local_30;
  
  std::make_shared<pbrt::CheckerTexture>();
  peVar2 = std::
           __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a1d58);
  local_30 = &peVar2->super_ParamSet;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffeb8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffeb8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Texture>::shared_ptr<pbrt::CheckerTexture,void>
                ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffec0,
                 (shared_ptr<pbrt::CheckerTexture> *)in_stack_fffffffffffffeb8);
      std::shared_ptr<pbrt::CheckerTexture>::~shared_ptr
                ((shared_ptr<pbrt::CheckerTexture> *)0x1a2158);
      SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)in_RDI;
      return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1a1db9);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff60,local_70);
    bVar1 = std::operator==(&in_stack_fffffffffffffec0->first,(char *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a1e13);
      fVar4 = syntactic::ParamSet::getParam1f
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff5c);
      peVar3 = std::
               __shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a1e3f);
      peVar3->uScale = fVar4;
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffec0->first,(char *)in_stack_fffffffffffffeb8);
      if (bVar1) {
        std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a1ed3);
        fVar4 = syntactic::ParamSet::getParam1f
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff5c);
        peVar3 = std::
                 __shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a1eff);
        peVar3->vScale = fVar4;
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffec0->first,(char *)in_stack_fffffffffffffeb8)
        ;
        if (bVar1) {
          std::
          __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a1f48);
          std::__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a1f5e);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffffec0->first,
                                  (char *)in_stack_fffffffffffffeb8);
          if (!bVar1) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_RDX,in_RDI);
            std::operator+(in_stack_fffffffffffffec8,(char *)this_00);
            std::runtime_error::runtime_error(this_00,local_c8);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          peVar2 = std::
                   __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a1fb7);
          in_stack_fffffffffffffec8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &peVar2->super_ParamSet;
          std::__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::CheckerTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a1fcd);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
    }
    in_stack_ffffffffffffff5c = 4.2039e-45;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffec0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffec0);
  } while( true );
}

Assistant:

Texture::SP SemanticParser::createTexture_checker(pbrt::syntactic::Texture::SP in)
  {
    CheckerTexture::SP tex = std::make_shared<CheckerTexture>();
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "uscale") {
        tex->uScale = in->getParam1f(name);
        continue;
      }
      if (name == "vscale") {
        tex->vScale = in->getParam1f(name);
        continue;
      }
      if (name == "tex1") {
        in->getParam3f(&tex->tex1.x,name);
        continue;
      }
      if (name == "tex2") {
        in->getParam3f(&tex->tex2.x,name);
        continue;
      }
      throw std::runtime_error("unknown checker texture param '"+name+"'");
    }
    return tex;
  }